

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

ON_SubDEdgePtr __thiscall
ON_SubDMeshFragment::SubDEdgePtr(ON_SubDMeshFragment *this,uint grid_side_index)

{
  ON_SubDEdgePtr OVar1;
  unsigned_short fei;
  uint grid_side_count;
  uint grid_side_index_local;
  ON_SubDMeshFragment *this_local;
  
  if (((this->m_face != (ON_SubDFace *)0x0) && (2 < this->m_face->m_edge_count)) &&
     (grid_side_index < 4)) {
    if (this->m_face_vertex_index[grid_side_index] < this->m_face->m_edge_count) {
      OVar1 = ON_SubDFace::EdgePtr(this->m_face,(uint)this->m_face_vertex_index[grid_side_index]);
      return (ON_SubDEdgePtr)OVar1.m_ptr;
    }
    if (this->m_face_vertex_index[grid_side_index + 1 & 3] < this->m_face->m_edge_count) {
      OVar1 = ON_SubDFace::EdgePtr
                        (this->m_face,
                         (int)((uint)this->m_face_vertex_index[grid_side_index + 1 & 3] +
                               (uint)this->m_face->m_edge_count + -1) %
                         (int)(uint)this->m_face->m_edge_count);
      return (ON_SubDEdgePtr)OVar1.m_ptr;
    }
  }
  return (ON_SubDEdgePtr)0;
}

Assistant:

const class ON_SubDEdgePtr ON_SubDMeshFragment::SubDEdgePtr(
  unsigned int grid_side_index
  ) const
{
  const unsigned int grid_side_count = 4; // will be 3 for a tri sub-D
  if (nullptr != m_face &&  m_face->m_edge_count >= 3 && grid_side_index < grid_side_count)
  {
    unsigned short fei = m_face_vertex_index[grid_side_index];
    if (fei < m_face->m_edge_count)
      return m_face->EdgePtr(fei);
    fei = m_face_vertex_index[(grid_side_index+1) % grid_side_count];
    if (fei < m_face->m_edge_count)
      return m_face->EdgePtr((fei+m_face->m_edge_count-1) % m_face->m_edge_count);
  }
  return ON_SubDEdgePtr::Null;
}